

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_get_nonexist_many(planck_unit_test_t *tc)

{
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_80;
  undefined4 local_7c;
  ion_dictionary_t local_78;
  ion_dictionary_handler_t local_60;
  
  bhdct_setup(tc,&local_60,&local_78,ion_fill_edge_cases);
  local_7c = 0xfffff830;
  bhdct_get(tc,&local_78,&local_7c,(ion_value_t)0x0,'\x01',0);
  local_80 = 3000;
  bhdct_get(tc,&local_78,&local_80,(ion_value_t)0x0,'\x01',0);
  bhdct_delete_dictionary(tc,&local_78);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_get_nonexist_many(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	bhdct_get(tc, &dict, IONIZE(-2000, int), NULL, err_item_not_found, 0);
	bhdct_get(tc, &dict, IONIZE(3000, int), NULL, err_item_not_found, 0);

	bhdct_takedown(tc, &dict);
}